

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hawktracer.cpp
# Opt level: O0

HT_TimelineListenerContainer * ht_timeline_listener_container_create(void)

{
  HT_ErrorCode HVar1;
  HT_Mutex *pHVar2;
  HT_TimelineListenerContainer *local_10;
  HT_TimelineListenerContainer *container;
  
  local_10 = (HT_TimelineListenerContainer *)ht_alloc(0x30);
  if (local_10 != (HT_TimelineListenerContainer *)0x0) {
    HVar1 = ht_bag_listener_init((HT_BagListener *)local_10,0x10);
    if (HVar1 == HT_ERR_OK) {
      pHVar2 = ht_mutex_create();
      local_10->mutex = pHVar2;
      if (local_10->mutex != (HT_Mutex *)0x0) {
        local_10->id = 0;
        local_10->refcount = 1;
        return local_10;
      }
      ht_bag_listener_deinit((HT_BagListener *)local_10);
    }
    ht_free(local_10);
    local_10 = (HT_TimelineListenerContainer *)0x0;
  }
  return local_10;
}

Assistant:

HT_TimelineListenerContainer*
ht_timeline_listener_container_create(void)
{
    HT_TimelineListenerContainer* container = HT_CREATE_TYPE(HT_TimelineListenerContainer);

    if (container == NULL)
    {
        goto done;
    }

    if (ht_bag_listener_init(&container->entries, 16) != HT_ERR_OK)
    {
        goto error_init_entries;
    }

    container->mutex = ht_mutex_create();
    if (container->mutex == NULL)
    {
        goto error_create_mutex;
    }

    container->id = 0;
    container->refcount = 1;
    goto done;

error_create_mutex:
    ht_bag_listener_deinit(&container->entries);
error_init_entries:
    ht_free(container);
    container = NULL;
done:
    return container;
}